

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetActiveTexture(GLContextState *this,Int32 Index)

{
  Char *pCVar1;
  undefined1 local_68 [8];
  string msg_1;
  GLenum err;
  undefined1 local_38 [8];
  string msg;
  Int32 Index_local;
  GLContextState *this_local;
  
  msg.field_2._12_4_ = Index;
  if (Index < 0) {
    msg.field_2._12_4_ = (this->m_Caps).MaxCombinedTexUnits + Index;
  }
  if (((int)msg.field_2._12_4_ < 0) ||
     ((this->m_Caps).MaxCombinedTexUnits <= (int)msg.field_2._12_4_)) {
    FormatString<char[29]>((string *)local_38,(char (*) [29])"Texture unit is out of range");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"SetActiveTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0xcd);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_iActiveTexture != msg.field_2._12_4_) {
    (*__glewActiveTexture)(msg.field_2._12_4_ + 0x84c0);
    msg_1.field_2._8_4_ = glGetError();
    if (msg_1.field_2._8_4_ != 0) {
      LogError<false,char[33],int,char[17],unsigned_int>
                (false,"SetActiveTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xd2,(char (*) [33])"Failed to activate texture slot ",
                 (int *)(msg.field_2._M_local_buf + 0xc),(char (*) [17])"\nGL Error Code: ",
                 (uint *)(msg_1.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_68,(char (*) [6])0x4585f6);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"SetActiveTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xd2);
      std::__cxx11::string::~string((string *)local_68);
    }
    this->m_iActiveTexture = msg.field_2._12_4_;
  }
  return;
}

Assistant:

void GLContextState::SetActiveTexture(Int32 Index)
{
    if (Index < 0)
    {
        Index += m_Caps.MaxCombinedTexUnits;
    }
    VERIFY(0 <= Index && Index < m_Caps.MaxCombinedTexUnits, "Texture unit is out of range");

    if (m_iActiveTexture != Index)
    {
        glActiveTexture(GL_TEXTURE0 + Index);
        DEV_CHECK_GL_ERROR("Failed to activate texture slot ", Index);
        m_iActiveTexture = Index;
    }
}